

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall deqp::gls::BuiltinPrecisionTests::Functions::Trunc::~Trunc(Trunc *this)

{
  CFloatFunc1::~CFloatFunc1((CFloatFunc1 *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

Trunc (void) : PreciseFunc1("trunc", deTrunc) {}